

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O2

size_t ver_get_last_wal_flush_hdr_off(filemgr_magic_t magic)

{
  undefined8 uStack_8;
  
  if (magic == 0xdeadcafebeefbeef) {
    uStack_8 = 0x28;
  }
  else if (magic == 0xdeadcafebeefc002) {
    uStack_8 = 0x38;
  }
  else if (magic == 0xdeadcafebeefc001) {
    uStack_8 = 0x30;
  }
  else {
    uStack_8 = 0xffffffffffffffff;
  }
  return uStack_8;
}

Assistant:

size_t ver_get_last_wal_flush_hdr_off(filemgr_magic_t magic) {
    switch(magic) {
        case FILEMGR_MAGIC_000: return 40;
        case FILEMGR_MAGIC_001: return 48;
        case FILEMGR_MAGIC_002: return 56;
    }
    return (size_t) -1;
}